

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Algorithms.cpp
# Opt level: O3

pair<BigIntegerLibrary::BigInteger,_BigIntegerLibrary::BigInteger> * __thiscall
Algorithms::discreteSquareRoot
          (pair<BigIntegerLibrary::BigInteger,_BigIntegerLibrary::BigInteger>
           *__return_storage_ptr__,Algorithms *this,BigInteger *p,BigInteger *n)

{
  void *pvVar1;
  int iVar2;
  int iVar3;
  BigInteger *pBVar4;
  bool bVar5;
  BigInteger x1;
  BigInteger x2;
  pair<BigIntegerLibrary::BigInteger,_BigIntegerLibrary::BigInteger> w;
  pair<BigIntegerLibrary::BigInteger,_BigIntegerLibrary::BigInteger> res;
  BigInteger a;
  BigInteger local_308;
  BigInteger local_2e8;
  BigInteger *local_2c8;
  pair<BigIntegerLibrary::BigInteger,_BigIntegerLibrary::BigInteger> local_2c0;
  BigInteger local_280;
  pair<BigIntegerLibrary::BigInteger,_BigIntegerLibrary::BigInteger> local_260;
  Algorithms *local_220;
  pair<BigIntegerLibrary::BigInteger,_BigIntegerLibrary::BigInteger> *local_218;
  BigInteger local_210;
  BigInteger local_1f0;
  BigInteger local_1d0;
  BigInteger local_1b0;
  BigInteger local_190;
  BigInteger local_170;
  BigInteger local_150;
  BigInteger local_130;
  BigInteger local_110;
  BigInteger local_f0;
  BigInteger local_d0;
  BigInteger local_b0;
  BigInteger local_90;
  pair<BigIntegerLibrary::BigInteger,_BigIntegerLibrary::BigInteger> local_70;
  
  local_2c8 = n;
  local_220 = this;
  BigIntegerLibrary::BigInteger::BigInteger(&local_f0,n);
  pBVar4 = &local_110;
  BigIntegerLibrary::BigInteger::BigInteger(pBVar4,p);
  iVar2 = legendreSymbol((Algorithms *)pBVar4,&local_f0,&local_110);
  if (local_110.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_110.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_110.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_110.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_f0.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_f0.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_f0.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_f0.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (iVar2 == -1) {
    BigIntegerLibrary::BigInteger::BigInteger(&local_2c0.first,-1);
    BigIntegerLibrary::BigInteger::BigInteger(&local_260.first,-1);
    std::pair<BigIntegerLibrary::BigInteger,_BigIntegerLibrary::BigInteger>::
    pair<BigIntegerLibrary::BigInteger,_BigIntegerLibrary::BigInteger,_true>
              (__return_storage_ptr__,&local_2c0.first,&local_260.first);
    pvVar1 = (void *)CONCAT44(local_260.first.num.super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_start._4_4_,
                              local_260.first.num.super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_start._0_4_);
    local_210.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = local_2c0.first.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
    local_210.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         local_2c0.first.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,(long)local_260.first.num.super__Vector_base<int,_std::allocator<int>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar1
                     );
      local_210.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = local_2c0.first.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
      local_210.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage =
           local_2c0.first.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
    }
    goto joined_r0x00109dba;
  }
  local_218 = __return_storage_ptr__;
  BigIntegerLibrary::BigInteger::BigInteger(&local_210);
  iVar2 = 99;
  do {
    BigIntegerLibrary::BigInteger::BigInteger(&local_130,1);
    BigIntegerLibrary::BigInteger::operator-(&local_90,p,1);
    random((Algorithms *)&local_2c0);
    BigIntegerLibrary::BigInteger::operator=(&local_210,&local_2c0.first);
    if (local_2c0.first.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_2c0.first.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_2c0.first.num.super__Vector_base<int,_std::allocator<int>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_2c0.first.num.super__Vector_base<int,_std::allocator<int>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_90.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_90.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_90.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_90.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_130.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_130.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_130.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_130.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    BigIntegerLibrary::BigInteger::operator*(&local_2c0.first,&local_210,&local_210);
    BigIntegerLibrary::BigInteger::operator-(&local_b0,&local_2c0.first,local_2c8);
    pBVar4 = &local_d0;
    BigIntegerLibrary::BigInteger::BigInteger(&local_d0,p);
    iVar3 = legendreSymbol((Algorithms *)pBVar4,&local_b0,&local_d0);
    if (local_d0.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_d0.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_d0.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_d0.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_b0.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_b0.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_b0.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_b0.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_2c0.first.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_2c0.first.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_2c0.first.num.super__Vector_base<int,_std::allocator<int>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_2c0.first.num.super__Vector_base<int,_std::allocator<int>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    bVar5 = iVar2 != 0;
    iVar2 = iVar2 + -1;
  } while ((iVar3 != -1) && (bVar5));
  BigIntegerLibrary::BigInteger::operator*(&local_2c0.first,&local_210,&local_210);
  BigIntegerLibrary::BigInteger::operator-(&local_150,&local_2c0.first,local_2c8);
  __return_storage_ptr__ = local_218;
  pBVar4 = &local_170;
  BigIntegerLibrary::BigInteger::BigInteger(pBVar4,p);
  iVar2 = legendreSymbol((Algorithms *)pBVar4,&local_150,&local_170);
  if (local_170.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_170.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_170.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_170.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_150.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_150.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_150.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_150.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_2c0.first.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2c0.first.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2c0.first.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2c0.first.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (iVar2 == -1) {
    local_260.first.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 1;
    std::pair<BigIntegerLibrary::BigInteger,_BigIntegerLibrary::BigInteger>::
    pair<BigIntegerLibrary::BigInteger_&,_int,_true>(&local_2c0,&local_210,(int *)&local_260);
    std::pair<BigIntegerLibrary::BigInteger,_BigIntegerLibrary::BigInteger>::pair
              (&local_70,&local_2c0);
    BigIntegerLibrary::BigInteger::operator+(&local_308,p,1);
    BigIntegerLibrary::BigInteger::operator/(&local_190,&local_308,2);
    BigIntegerLibrary::BigInteger::BigInteger(&local_1b0,p);
    BigIntegerLibrary::BigInteger::operator*(&local_2e8,&local_210,&local_210);
    BigIntegerLibrary::BigInteger::operator-(&local_1d0,&local_2e8,local_2c8);
    powComplexMod(&local_260,local_220,&local_70,&local_190,&local_1b0,&local_1d0);
    if (local_1d0.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_1d0.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_1d0.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_1d0.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_2e8.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_2e8.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_2e8.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_2e8.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_1b0.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_1b0.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_1b0.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_1b0.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_190.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_190.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_190.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_190.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_308.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_308.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_308.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_308.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_70.second.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_70.second.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_70.second.num.super__Vector_base<int,_std::allocator<int>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_70.second.num.super__Vector_base<int,_std::allocator<int>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_70.first.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_70.first.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_70.first.num.super__Vector_base<int,_std::allocator<int>_>._M_impl
                            .super__Vector_impl_data._M_end_of_storage -
                      (long)local_70.first.num.super__Vector_base<int,_std::allocator<int>_>._M_impl
                            .super__Vector_impl_data._M_start);
    }
    BigIntegerLibrary::BigInteger::BigInteger(&local_308,0);
    bVar5 = BigIntegerLibrary::BigInteger::operator==(&local_260.second,&local_308);
    if (local_308.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_308.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_308.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_308.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (bVar5) {
      BigIntegerLibrary::BigInteger::BigInteger(&local_308,&local_260.first);
      while( true ) {
        BigIntegerLibrary::BigInteger::BigInteger(&local_2e8,0);
        bVar5 = BigIntegerLibrary::BigInteger::operator<(&local_308,&local_2e8);
        if (local_2e8.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_2e8.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_2e8.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_2e8.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if (!bVar5) break;
        BigIntegerLibrary::BigInteger::operator+=(&local_308,p);
      }
      BigIntegerLibrary::BigInteger::operator-(&local_280,p,&local_308);
      BigIntegerLibrary::BigInteger::operator%(&local_2e8,&local_280,p);
      if (local_280.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_280.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_280.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_280.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      BigIntegerLibrary::BigInteger::operator*(&local_1f0,&local_308,&local_308);
      BigIntegerLibrary::BigInteger::operator%(&local_280,&local_1f0,p);
      bVar5 = BigIntegerLibrary::BigInteger::operator==(&local_280,local_2c8);
      if (local_280.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_280.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_280.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_280.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_1f0.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1f0.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_1f0.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_1f0.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (!bVar5) {
        if (local_2e8.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_2e8.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_2e8.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_2e8.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if (local_308.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_308.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_308.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_308.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        goto LAB_0010a105;
      }
      std::pair<BigIntegerLibrary::BigInteger,_BigIntegerLibrary::BigInteger>::
      pair<BigIntegerLibrary::BigInteger_&,_BigIntegerLibrary::BigInteger_&,_true>
                (__return_storage_ptr__,&local_308,&local_2e8);
    }
    else {
LAB_0010a105:
      BigIntegerLibrary::BigInteger::BigInteger(&local_308,-1);
      BigIntegerLibrary::BigInteger::BigInteger(&local_2e8,-1);
      std::pair<BigIntegerLibrary::BigInteger,_BigIntegerLibrary::BigInteger>::
      pair<BigIntegerLibrary::BigInteger,_BigIntegerLibrary::BigInteger,_true>
                (__return_storage_ptr__,&local_308,&local_2e8);
    }
    if (local_2e8.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_2e8.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_2e8.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_2e8.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_308.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_308.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_308.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_308.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_260.second.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_260.second.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_260.second.num.super__Vector_base<int,_std::allocator<int>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_260.second.num.super__Vector_base<int,_std::allocator<int>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    pvVar1 = (void *)CONCAT44(local_260.first.num.super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_start._4_4_,
                              local_260.first.num.super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_start._0_4_);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,(long)local_260.first.num.super__Vector_base<int,_std::allocator<int>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar1
                     );
    }
  }
  else {
    BigIntegerLibrary::BigInteger::BigInteger(&local_2c0.first,-1);
    BigIntegerLibrary::BigInteger::BigInteger(&local_260.first,-1);
    std::pair<BigIntegerLibrary::BigInteger,_BigIntegerLibrary::BigInteger>::
    pair<BigIntegerLibrary::BigInteger,_BigIntegerLibrary::BigInteger,_true>
              (__return_storage_ptr__,&local_2c0.first,&local_260.first);
    local_2c0.second.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_260.first.num.super__Vector_base<int,_std::allocator<int>_>._M_impl
                           .super__Vector_impl_data._M_start._4_4_,
                           local_260.first.num.super__Vector_base<int,_std::allocator<int>_>._M_impl
                           .super__Vector_impl_data._M_start._0_4_);
    local_2c0.second.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_260.first.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
  }
  if (local_2c0.second.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2c0.second.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2c0.second.num.super__Vector_base<int,_std::allocator<int>_>._M_impl
                          .super__Vector_impl_data._M_end_of_storage -
                    (long)local_2c0.second.num.super__Vector_base<int,_std::allocator<int>_>._M_impl
                          .super__Vector_impl_data._M_start);
  }
  if (local_2c0.first.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2c0.first.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2c0.first.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2c0.first.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
joined_r0x00109dba:
  if (local_210.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_210.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_210.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_210.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

pair<BigInteger, BigInteger> Algorithms::discreteSquareRoot(BigInteger p, BigInteger n) {
    if(legendreSymbol(n, p) == -1) {
        return {BigInteger(-1), BigInteger(-1)};
    }
    BigInteger a;
    for(int i = 0; i < 100; ++i) {
        a = random(1, p - 1);
        if(legendreSymbol(a * a - n, p) == -1) {
            break;
        }
    }
    if(legendreSymbol(a * a - n, p) != -1) {
        return {BigInteger(-1), BigInteger(-1)};
    }

    pair<BigInteger, BigInteger> w{a, 1};
    auto res = powComplexMod(w, (p + 1) / 2, p, a * a - n);
    if(res.second == BigInteger(0)) {
        BigInteger x1 = res.first;
        while (x1 < 0) {
            x1 += p;
        }
        BigInteger x2 = (p - x1) % p;
        if (x1 * x1 % p == n) {
            return {x1, x2};
        }
    }
    return {BigInteger(-1), BigInteger(-1)};

}